

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O0

ll_node * wal_read(sptr_t data,sptr_t palette)

{
  int32_t iVar1;
  sptr_t palette_local;
  sptr_t data_local;
  
  if (data.ptr == (uchar *)0x0) {
    data_local.size = 0;
  }
  else if (data.size < 0x37c) {
    data_local.size = 0;
  }
  else {
    iVar1 = wal_get_type(data.ptr);
    if (iVar1 == 1) {
      data_local.size = (size_t)wal_q2_read(data,palette);
    }
    else if (iVar1 == 2) {
      data_local.size = (size_t)wal_dk_read(data,palette);
    }
    else {
      data_local.size = 0;
    }
  }
  return (ll_node *)data_local.size;
}

Assistant:

struct ll_node *wal_read(const sptr_t data, const sptr_t palette)
{
	if (SPTR_IS_NULL(data)) {
		return NULL;
	}
	/* Daikatana header is bigger */
	if (data.size < WAL_DK_HEADER_SIZE) {
		return NULL;
	}
	switch (wal_get_type(data.ptr)) {
		case WAL_TYPE_QUAKE2:
			return wal_q2_read(data, palette);
		case WAL_TYPE_DAIKATANA:
			return wal_dk_read(data, palette);
		default:
			return NULL;
	}
}